

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence.h
# Opt level: O0

void __thiscall spvtools::opt::DistanceEntry::DistanceEntry(DistanceEntry *this)

{
  DistanceEntry *this_local;
  
  this->dependence_information = UNKNOWN;
  this->direction = ALL;
  this->distance = 0;
  this->peel_first = false;
  this->peel_last = false;
  this->point_x = 0;
  this->point_y = 0;
  return;
}

Assistant:

DistanceEntry()
      : dependence_information(DependenceInformation::UNKNOWN),
        direction(Directions::ALL),
        distance(0),
        peel_first(false),
        peel_last(false),
        point_x(0),
        point_y(0) {}